

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm_manager.cc
# Opt level: O0

RC __thiscall SM_Manager::PrintPageStats(SM_Manager *this)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  ostream *poVar4;
  void *pvVar5;
  int *piPNF;
  int *piPF;
  int *piGP;
  SM_Manager *this_local;
  
  piVar1 = StatisticsMgr::Get(pStatisticsMgr,PF_GETPAGE);
  piVar2 = StatisticsMgr::Get(pStatisticsMgr,PF_PAGEFOUND);
  piVar3 = StatisticsMgr::Get(pStatisticsMgr,PF_PAGENOTFOUND);
  poVar4 = std::operator<<((ostream *)&std::cout,"PF Layer Statistics");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"-------------------");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  if (piVar1 == (int *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Total number of calls to GetPage Routine: None")
    ;
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"Total number of calls to GetPage Routine: ");
    pvVar5 = (void *)std::ostream::operator<<(poVar4,*piVar1);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  }
  if (piVar2 == (int *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"  Number found: None");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"  Number found: ");
    pvVar5 = (void *)std::ostream::operator<<(poVar4,*piVar2);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  }
  if (piVar3 == (int *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"  Number found: None");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"  Number not found: ");
    pvVar5 = (void *)std::ostream::operator<<(poVar4,*piVar3);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  }
  return 0;
}

Assistant:

RC SM_Manager::PrintPageStats(){
  int *piGP = pStatisticsMgr->Get(PF_GETPAGE);
  int *piPF = pStatisticsMgr->Get(PF_PAGEFOUND);
  int *piPNF = pStatisticsMgr->Get(PF_PAGENOTFOUND);

  cout << "PF Layer Statistics" << endl;
  cout << "-------------------" << endl;
  if(piGP)
    cout << "Total number of calls to GetPage Routine: " << *piGP << endl;
  else
    cout << "Total number of calls to GetPage Routine: None" << endl;
  if(piPF)
    cout << "  Number found: " << *piPF << endl;
  else
    cout << "  Number found: None" << endl;
  if(piPNF)
    cout << "  Number not found: " << *piPNF << endl;
  else
    cout << "  Number found: None" << endl;
  return (0);
}